

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void Arith(lua_State *L,StkId ra,TValue *rb,TValue *rc,TMS op)

{
  double __y;
  int iVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  double *in_RSI;
  undefined4 in_R8D;
  double dVar4;
  double dVar5;
  TValue *i_o_6;
  TValue *i_o_5;
  TValue *i_o_4;
  TValue *i_o_3;
  TValue *i_o_2;
  TValue *i_o_1;
  TValue *i_o;
  lua_Number nc;
  lua_Number nb;
  TValue *c;
  TValue *b;
  TValue tempc;
  TValue tempb;
  TMS in_stack_ffffffffffffff4c;
  TValue *in_stack_ffffffffffffff50;
  TValue *in_stack_ffffffffffffff58;
  lua_State *in_stack_ffffffffffffff60;
  lua_State *in_stack_ffffffffffffff68;
  
  pTVar2 = luaV_tonumber(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if ((pTVar2 == (TValue *)0x0) ||
     (pTVar3 = luaV_tonumber(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50),
     pTVar3 == (TValue *)0x0)) {
    iVar1 = call_binTM(in_stack_ffffffffffffff68,(TValue *)in_stack_ffffffffffffff60,
                       in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
                      );
    if (iVar1 == 0) {
      luaG_aritherror(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50)
      ;
    }
  }
  else {
    dVar5 = (pTVar2->value).n;
    __y = (pTVar3->value).n;
    switch(in_R8D) {
    case 5:
      *in_RSI = dVar5 + __y;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 6:
      *in_RSI = dVar5 - __y;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 7:
      *in_RSI = dVar5 * __y;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 8:
      *in_RSI = dVar5 / __y;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 9:
      dVar4 = floor(dVar5 / __y);
      *in_RSI = -dVar4 * __y + dVar5;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 10:
      dVar5 = pow(dVar5,__y);
      *in_RSI = dVar5;
      *(undefined4 *)(in_RSI + 1) = 3;
      break;
    case 0xb:
      *in_RSI = -dVar5;
      *(undefined4 *)(in_RSI + 1) = 3;
    }
  }
  return;
}

Assistant:

static void Arith(lua_State*L,StkId ra,const TValue*rb,
const TValue*rc,TMS op){
TValue tempb,tempc;
const TValue*b,*c;
if((b=luaV_tonumber(rb,&tempb))!=NULL&&
(c=luaV_tonumber(rc,&tempc))!=NULL){
lua_Number nb=nvalue(b),nc=nvalue(c);
switch(op){
case TM_ADD:setnvalue(ra,luai_numadd(nb,nc));break;
case TM_SUB:setnvalue(ra,luai_numsub(nb,nc));break;
case TM_MUL:setnvalue(ra,luai_nummul(nb,nc));break;
case TM_DIV:setnvalue(ra,luai_numdiv(nb,nc));break;
case TM_MOD:setnvalue(ra,luai_nummod(nb,nc));break;
case TM_POW:setnvalue(ra,luai_numpow(nb,nc));break;
case TM_UNM:setnvalue(ra,luai_numunm(nb));break;
default:break;
}
}
else if(!call_binTM(L,rb,rc,ra,op))
luaG_aritherror(L,rb,rc);
}